

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

AppendResult __thiscall
metaf::VisibilityGroup::append
          (VisibilityGroup *this,string *group,ReportPart reportPart,ReportMetadata *reportMetadata)

{
  AppendResult AVar1;
  optional<std::pair<metaf::Direction,_metaf::Direction>_> d;
  
  AVar1 = (*(code *)(&DAT_002761c4 + *(int *)(&DAT_002761c4 + (ulong)this->incompleteText * 4)))();
  return AVar1;
}

Assistant:

AppendResult VisibilityGroup::append(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportPart;(void)reportMetadata;

	switch (incompleteText) {
		case IncompleteText::NONE:
		return AppendResult::NOT_APPENDED;

		case IncompleteText::INTEGER:
		if (appendFractionToIncompleteInteger(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;
		
		case IncompleteText::VIS:
		if (group == "MISG") {
			visType = Type::VIS_MISG;
			incompleteText = IncompleteText::NONE;
			return AppendResult::APPENDED; 
		}
		if (appendDirection(group, IncompleteText::VIS_DIR)) return AppendResult::APPENDED;
		if (appendInteger(group, IncompleteText::VIS_INTEGER)) return AppendResult::APPENDED;
		if (appendFraction(group, IncompleteText::VIS_FRACTION_OR_METERS)) return AppendResult::APPENDED;
		if (appendVariable(group, IncompleteText::VIS_VAR_MAX_INT, IncompleteText::VIS_VAR)) return AppendResult::APPENDED;
		if (appendMeters(group, IncompleteText::VIS_FRACTION_OR_METERS)) return AppendResult::APPENDED;
		if (appendVariableMeters(group, IncompleteText::VIS_VAR)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VIS_INTEGER:
		if (appendVariable(group, IncompleteText::VIS_VAR_MAX_INT, IncompleteText::VIS_VAR)) return AppendResult::APPENDED;
		if (appendFraction(group, IncompleteText::VIS_FRACTION_OR_METERS)) return AppendResult::APPENDED;
		if (appendRunway(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VIS_VAR_MAX_INT:
		if (appendVariableMaxFraction(group, IncompleteText::VIS_VAR)) return AppendResult::APPENDED;
		if (appendRunway(group)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::VIS_VAR:
		if (appendRunway(group)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::VIS_FRACTION_OR_METERS:
		if (appendRunway(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VIS_DIR:
		if (appendInteger(group, IncompleteText::VIS_DIR_INTEGER)) return AppendResult::APPENDED;
		if (appendVariable(group, IncompleteText::VIS_DIR_VAR_MAX_INT)) return AppendResult::APPENDED;
		if (appendFraction(group)) return AppendResult::APPENDED;
		if (appendVariableMeters(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VIS_DIR_INTEGER:
		if (appendFraction(group)) return AppendResult::APPENDED;
		if (appendVariable(group, IncompleteText::VIS_DIR_VAR_MAX_INT)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::VIS_DIR_VAR_MAX_INT:
		if (appendVariableMaxFraction(group)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::SFC_OR_TWR:
		if (group == "VIS") {
			incompleteText = IncompleteText::SFC_OR_TWR_VIS;
			return AppendResult::APPENDED;
		}
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::SFC_OR_TWR_VIS:
		if (appendInteger(group, IncompleteText::SFC_OR_TWR_VIS_INTEGER)) return AppendResult::APPENDED;
		if (appendFraction(group)) return AppendResult::APPENDED;
		if (appendMeters(group)) return AppendResult::APPENDED;
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::SFC_OR_TWR_VIS_INTEGER:
		if (appendFraction(group)) return AppendResult::APPENDED;
		if (appendVariable(group)) return AppendResult::GROUP_INVALIDATED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;

		case IncompleteText::RVR:
		if (group == "MISG") {
			incompleteText = IncompleteText::NONE;
			return AppendResult::APPENDED;
		}
		return AppendResult::GROUP_INVALIDATED;

		case IncompleteText::VISNO:
		if (appendRunway(group)) return AppendResult::APPENDED;
		if (appendDirection(group)) return AppendResult::APPENDED;
		incompleteText = IncompleteText::NONE;
		return AppendResult::NOT_APPENDED;
	}
}